

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O3

void do_convert(uchar **to_p,uchar **from_p,char *code)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  char cVar6;
  long lVar7;
  uchar **ppuVar8;
  byte bVar9;
  bool bVar10;
  
  iVar3 = strcmp(code,"JIS7");
  if ((iVar3 == 0) || (iVar3 = strcmp(code,"jis"), iVar3 == 0)) {
    cVar6 = *(char *)from_p;
    if (cVar6 == '\0') goto LAB_0012326b;
    bVar10 = false;
    bVar2 = false;
    iVar3 = 0;
    lVar7 = 0;
    ppuVar8 = from_p;
    do {
      iVar4 = (int)lVar7;
      if (cVar6 == '\x1b') {
        lVar7 = (long)iVar4;
        cVar6 = *(char *)((long)from_p + lVar7 + 1);
        if (cVar6 == '(') {
          iVar4 = iVar4 + 2;
          bVar10 = *(char *)((long)from_p + lVar7 + 2) == 'I';
LAB_00123153:
          bVar2 = false;
        }
        else {
          if (cVar6 == '$') {
            iVar4 = iVar4 + 2;
            bVar10 = false;
            goto LAB_0012311c;
          }
          iVar4 = iVar4 + 1;
        }
      }
      else {
        if (!bVar2) {
          if (!bVar10) {
            lVar7 = (long)iVar3;
            iVar3 = iVar3 + 1;
            *(char *)((long)to_p + lVar7) = cVar6;
            bVar2 = false;
            bVar10 = false;
            goto LAB_0012316b;
          }
          lVar7 = (long)iVar3;
          *(undefined1 *)((long)to_p + lVar7) = 0x8e;
          iVar3 = iVar3 + 2;
          *(char *)((long)to_p + lVar7 + 1) = *(char *)ppuVar8 + -0x80;
          bVar10 = true;
          goto LAB_00123153;
        }
        lVar7 = (long)iVar3;
        iVar3 = iVar3 + 1;
        *(char *)((long)to_p + lVar7) = cVar6 + -0x80;
LAB_0012311c:
        bVar2 = true;
      }
LAB_0012316b:
      lVar7 = (long)iVar4;
      cVar6 = *(char *)((long)from_p + lVar7 + 1);
      if (cVar6 == '\0') break;
      ppuVar8 = (uchar **)((long)from_p + lVar7 + 1);
      lVar7 = lVar7 + 1;
    } while (iVar3 < 0x2000);
  }
  else {
    iVar3 = strcmp(code,"SJIS");
    if (iVar3 != 0) {
      gd_error("invalid code specification: \"%s\"",code);
      return;
    }
    bVar5 = *(byte *)from_p;
    if (bVar5 == 0) {
LAB_0012326b:
      iVar3 = 0;
      goto LAB_0012326d;
    }
    iVar3 = 0;
    lVar7 = 0;
    do {
      iVar4 = (int)lVar7;
      if (bVar5 < 0x7f) {
        lVar7 = (long)iVar3;
        iVar3 = iVar3 + 1;
        *(byte *)((long)to_p + lVar7) = bVar5;
      }
      else if ((byte)(bVar5 + 0x5f) < 0x3f) {
        lVar7 = (long)iVar3;
        *(undefined1 *)((long)to_p + lVar7) = 0x8e;
        iVar3 = iVar3 + 2;
        *(byte *)((long)to_p + lVar7 + 1) = bVar5;
      }
      else {
        bVar1 = *(byte *)((long)from_p + (long)iVar4 + 1);
        iVar4 = iVar4 + 1;
        bVar9 = bVar1 >> 7 ^ 0xe1;
        if (bVar1 >= 0x9f) {
          bVar9 = 0x82;
        }
        lVar7 = (long)iVar3;
        *(byte *)((long)to_p + lVar7) =
             (((0x9f < bVar5) * '@' + bVar5) * '\x02' - (bVar1 < 0x9f)) + -0x60;
        iVar3 = iVar3 + 2;
        *(byte *)((long)to_p + lVar7 + 1) = bVar9 + bVar1 + -0x80;
      }
      bVar5 = *(byte *)((long)from_p + (long)iVar4 + 1);
    } while ((bVar5 != 0) && (lVar7 = (long)iVar4 + 1, iVar3 < 0x2000));
  }
  if (0x1fff < iVar3) {
    gd_error("output buffer overflow at do_convert()");
    strcpy((char *)to_p,(char *)from_p);
    return;
  }
LAB_0012326d:
  *(undefined1 *)((long)to_p + (long)iVar3) = 0;
  return;
}

Assistant:

static void
do_convert (unsigned char **to_p, unsigned char **from_p, const char *code)
{
	unsigned char *to = *to_p;
	unsigned char *from = *from_p;
#ifdef HAVE_ICONV
	iconv_t cd;
	size_t from_len, to_len;

	if ((cd = iconv_open (EUCSTR, code)) == (iconv_t) - 1) {
		gd_error ("iconv_open() error");
#ifdef HAVE_ERRNO_H
		if (errno == EINVAL)
			gd_error ("invalid code specification: \"%s\" or \"%s\"", EUCSTR, code);
#endif
		ustrcpy (to, from);
		return;
	}

	from_len = strlen ((const char *)from) + 1;
	to_len = BUFSIZ;

	if ((int) (iconv (cd, (char **)from_p, &from_len, (char **)to_p, &to_len))
	        == -1) {
#ifdef HAVE_ERRNO_H
		if (errno == EINVAL)
			gd_error ("invalid end of input string");
		else if (errno == EILSEQ)
			gd_error ("invalid code in input string");
		else if (errno == E2BIG)
			gd_error ("output buffer overflow at do_convert()");
		else
#endif
			gd_error ("something happen");
		ustrcpy (to, from);
		return;
	}

	if (iconv_close (cd) != 0) {
		gd_error ("iconv_close() error");
	}
#else
	int p1, p2, i, j;
	int jisx0208 = FALSE;
	int hankaku = FALSE;

	j = 0;
	if (strcmp (code, NEWJISSTR) == 0 || strcmp (code, OLDJISSTR) == 0) {
		for (i = 0; from[i] != '\0' && j < BUFSIZ; i++) {
			if (from[i] == ESC) {
				i++;
				if (from[i] == '$') {
					jisx0208 = TRUE;
					hankaku = FALSE;
					i++;
				} else if (from[i] == '(') {
					jisx0208 = FALSE;
					i++;
					if (from[i] == 'I')	/* Hankaku Kana */
						hankaku = TRUE;
					else
						hankaku = FALSE;
				}
			} else {
				if (jisx0208)
					to[j++] = from[i] + 128;
				else if (hankaku) {
					to[j++] = SS2;
					to[j++] = from[i] + 128;
				} else
					to[j++] = from[i];
			}
		}
	} else if (strcmp (code, SJISSTR) == 0) {
		for (i = 0; from[i] != '\0' && j < BUFSIZ; i++) {
			p1 = from[i];
			if (p1 < 127)
				to[j++] = p1;
			else if ((p1 >= 161) && (p1 <= 223)) {
				/* Hankaku Kana */
				to[j++] = SS2;
				to[j++] = p1;
			} else {
				p2 = from[++i];
				SJIStoJIS (&p1, &p2);
				to[j++] = p1 + 128;
				to[j++] = p2 + 128;
			}
		}
	} else {
		gd_error ("invalid code specification: \"%s\"", code);
		return;
	}

	if (j >= BUFSIZ) {
		gd_error ("output buffer overflow at do_convert()");
		ustrcpy (to, from);
	} else
		to[j] = '\0';
#endif /* HAVE_ICONV */
}